

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O0

void google::protobuf::internal::WireFormatLite::WriteGroup
               (int field_number,MessageLite *value,CodedOutputStream *output)

{
  CodedOutputStream *output_local;
  MessageLite *value_local;
  int field_number_local;
  
  WriteTag(field_number,WIRETYPE_START_GROUP,output);
  MessageLite::SerializeWithCachedSizes(value,output);
  WriteTag(field_number,WIRETYPE_END_GROUP,output);
  return;
}

Assistant:

void WireFormatLite::WriteGroup(int field_number, const MessageLite& value,
                                io::CodedOutputStream* output) {
  WriteTag(field_number, WIRETYPE_START_GROUP, output);
  value.SerializeWithCachedSizes(output);
  WriteTag(field_number, WIRETYPE_END_GROUP, output);
}